

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::processInitCommand(CoreBroker *this,ActionMessage *cmd)

{
  BrokerBase *this_00;
  action_t aVar1;
  GlobalFederateId federateID;
  BaseTimeCoordinator *pBVar2;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  bool bVar3;
  int iVar4;
  BasicBrokerInfo *pBVar5;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  undefined1 local_d8 [184];
  
  aVar1 = cmd->messageAction;
  if (aVar1 == cmd_init_not_ready) {
    bVar3 = allInitReady(this);
    if (bVar3) {
      if ((this->super_BrokerBase).field_0x294 == '\x01') {
        message._M_str = "received init not ready but already init";
        message._M_len = 0x28;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,3,name,
                   message,false);
        return;
      }
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,cmd);
    }
    pBVar5 = getBrokerById(this,(GlobalBrokerId)(cmd->source_id).gid);
    if (pBVar5 != (BasicBrokerInfo *)0x0) {
      pBVar5->state = CONNECTED;
      pBVar5->initIterating = false;
    }
  }
  else if (aVar1 == cmd_init_grant) {
    if ((cmd->flags & 0x300) != 0) {
      routeMessage(this,cmd);
      return;
    }
    if ((cmd->flags & 1) != 0) {
LAB_002e11fe:
      executeInitializationOperations(this,true);
      return;
    }
    iVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            compare(&(this->super_BrokerBase).brokerKey,"**");
    if ((iVar4 == 0) && (5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i)) {
      message_00._M_str = "Broker started with universal key";
      message_00._M_len = 0x21;
      name_00._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_00._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger
                (&this->super_BrokerBase,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,6,name_00,
                 message_00,false);
    }
    BrokerBase::setBrokerState(&this->super_BrokerBase,OPERATING);
    broadcast(this,cmd);
    pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    (*pBVar2->_vptr_BaseTimeCoordinator[10])(pBVar2,0);
    pBVar2 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    iVar4 = (*pBVar2->_vptr_BaseTimeCoordinator[9])(pBVar2,0x8831d580);
    if ((char)iVar4 == '\0') {
      (this->super_BrokerBase).enteredExecutionMode = true;
    }
  }
  else if ((aVar1 == cmd_init) &&
          (pBVar5 = getBrokerById(this,(GlobalBrokerId)(cmd->source_id).gid),
          pBVar5 != (BasicBrokerInfo *)0x0)) {
    if (pBVar5->state == CONNECTED) {
      pBVar5->state = INIT_REQUESTED;
    }
    if ((((this->super_BrokerBase).dynamicFederation == false) && (pBVar5->_observer != true)) ||
       ((this->super_BrokerBase).brokerState._M_i < OPERATING)) {
      if ((cmd->flags & 1) != 0) {
        pBVar5->initIterating = true;
        (this->super_BrokerBase).field_0x296 = 1;
      }
      bVar3 = allInitReady(this);
      if (bVar3) {
        this_00 = &this->super_BrokerBase;
        if ((this->super_BrokerBase).field_0x294 != '\x01') {
          if (0xe < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
            message_01._M_str = "entering initialization mode";
            message_01._M_len = 0x1c;
            name_01._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
            name_01._M_len = (this->super_BrokerBase).identifier._M_string_length;
            BrokerBase::sendToLogger
                      (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid
                       ,0xf,name_01,message_01,false);
          }
          checkDependencies(this);
          (cmd->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
          if ((this->super_BrokerBase).field_0x296 == '\x01') {
            *(byte *)&cmd->flags = (byte)cmd->flags | 1;
          }
          goto LAB_002e12ae;
        }
        if ((this->super_BrokerBase).field_0x296 == '\x01') goto LAB_002e11fe;
        if (0xe < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
          message_02._M_str = "entering initialization mode";
          message_02._M_len = 0x1c;
          name_02._M_str = "root";
          name_02._M_len = 4;
          BrokerBase::sendToLogger
                    (this_00,(GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                     0xf,name_02,message_02,false);
        }
        if (5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
          federateID.gid = (this->super_BrokerBase).global_broker_id_local.gid;
          generateFederationSummary_abi_cxx11_((string *)local_d8,this);
          message_03._M_str = (char *)local_d8._0_8_;
          message_03._M_len = local_d8._8_8_;
          name_03._M_str = "root";
          name_03._M_len = 4;
          BrokerBase::sendToLogger(this_00,federateID,6,name_03,message_03,false);
          if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
            operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
          }
        }
        executeInitializationOperations(this,false);
      }
    }
    else {
      if ((this->super_BrokerBase).field_0x294 != '\x01') {
LAB_002e12ae:
        (*(this->super_Broker)._vptr_Broker[0x22])(this,0,cmd);
        return;
      }
      ActionMessage::ActionMessage
                ((ActionMessage *)local_d8,cmd_init_grant,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,
                 (GlobalFederateId)(cmd->source_id).gid);
      if ((cmd->flags & 1) != 0) {
        local_d8._26_2_ = local_d8._26_2_ | 1;
      }
      local_d8._26_2_ = local_d8._26_2_ | (pBVar5->_observer ^ 1) * 0x100 + 0x100;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)(pBVar5->route).rid);
      ActionMessage::~ActionMessage((ActionMessage *)local_d8);
    }
  }
  return;
}

Assistant:

void CoreBroker::processInitCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_INIT: {
            auto* brk = getBrokerById(static_cast<GlobalBrokerId>(cmd.source_id));

            if (brk == nullptr) {
                break;
            }
            if (brk->state == ConnectionState::CONNECTED) {
                brk->state = ConnectionState::INIT_REQUESTED;
            }

            if ((dynamicFederation || brk->_observer) &&
                getBrokerState() >= BrokerState::OPERATING) {
                if (isRootc) {
                    ActionMessage grant(CMD_INIT_GRANT, global_broker_id_local, cmd.source_id);
                    if (checkActionFlag(cmd, iteration_requested_flag)) {
                        setActionFlag(grant, iteration_requested_flag);
                    }
                    if (brk->_observer) {
                        setActionFlag(grant, observer_flag);
                    } else {
                        setActionFlag(grant, dynamic_join_flag);
                    }
                    transmit(brk->route, grant);
                } else {
                    transmit(parent_route_id, cmd);
                }
            } else {
                if (checkActionFlag(cmd, iteration_requested_flag)) {
                    brk->initIterating = true;
                    initIterating = true;
                }
                if (allInitReady()) {
                    if (isRootc) {
                        if (initIterating) {
                            executeInitializationOperations(true);
                        } else {
                            LOG_TIMING(global_broker_id_local,
                                       "root",
                                       "entering initialization mode");
                            LOG_SUMMARY(global_broker_id_local,
                                        "root",
                                        generateFederationSummary());
                            executeInitializationOperations(false);
                        }

                    } else {
                        LOG_TIMING(global_broker_id_local,
                                   getIdentifier(),
                                   "entering initialization mode");
                        checkDependencies();
                        cmd.source_id = global_broker_id_local;
                        if (initIterating) {
                            setActionFlag(cmd, iteration_requested_flag);
                        }
                        transmit(parent_route_id, cmd);
                    }
                }
            }

        } break;
        case CMD_INIT_NOT_READY: {
            if (allInitReady()) {
                if (isRootc) {
                    LOG_WARNING(global_broker_id_local,
                                getIdentifier(),
                                "received init not ready but already init");
                    break;
                }
                transmit(parent_route_id, cmd);
            }
            auto* brk = getBrokerById(GlobalBrokerId{cmd.source_id});
            if (brk != nullptr) {
                brk->state = ConnectionState::CONNECTED;
                brk->initIterating = false;
            }
        } break;
        case CMD_INIT_GRANT:
            if (!(checkActionFlag(cmd, observer_flag) || checkActionFlag(cmd, dynamic_join_flag))) {
                if (checkActionFlag(cmd, iteration_requested_flag)) {
                    executeInitializationOperations(true);
                } else {
                    if (brokerKey == universalKey) {
                        LOG_SUMMARY(global_broker_id_local,
                                    getIdentifier(),
                                    "Broker started with universal key");
                    }
                    setBrokerState(BrokerState::OPERATING);
                    broadcast(cmd);
                    timeCoord->enteringExecMode();
                    auto res = timeCoord->checkExecEntry();
                    if (res == MessageProcessingResult::NEXT_STEP) {
                        enteredExecutionMode = true;
                    }
                }
            } else {
                routeMessage(std::move(cmd));
            }
            break;
        default:
            break;
    }
}